

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exp.cpp
# Opt level: O1

void Exp::genDBData(double fraction)

{
  char *pcVar1;
  pointer pcVar2;
  pointer pbVar3;
  char cVar4;
  long *plVar5;
  istream *piVar6;
  long lVar7;
  BadBoy *this;
  ostream *poVar8;
  long *plVar9;
  ulong *puVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_type *psVar12;
  int iVar13;
  char *__end;
  undefined8 uVar14;
  undefined8 *puVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  pointer pbVar20;
  pointer pbVar21;
  pointer ppVar22;
  double dVar23;
  undefined1 auVar24 [16];
  string sigstr_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t_sigs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string cur_lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t;
  string file;
  string cur_rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cells;
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  rules;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cells_full;
  string files [1];
  string cell;
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  app_rules;
  ofstream fout4;
  ofstream fout3;
  timeval t1;
  ofstream fout2;
  ofstream fout1;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_c98;
  int local_c8c;
  undefined1 local_c88 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_c70;
  long *local_c50;
  long local_c48;
  long local_c40;
  long lStack_c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c30;
  long *local_c10;
  long local_c08;
  long local_c00;
  long lStack_bf8;
  long *local_bf0;
  undefined8 local_be8;
  PolynomialJoiner *local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  double local_bb8;
  double dStack_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  ios_base *local_b80;
  ios_base *local_b78;
  ios_base *local_b70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b68;
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_b50;
  undefined1 *local_b38 [2];
  undefined1 local_b28 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b18;
  undefined1 *local_af8;
  long local_af0;
  undefined1 local_ae8 [24];
  ios_base *local_ad0;
  undefined1 *local_ac8;
  undefined8 local_ac0;
  undefined1 local_ab8 [16];
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_aa8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a90;
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_a78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a60;
  undefined1 local_a48 [8];
  size_type local_a40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a38 [31];
  long *local_848;
  long local_840;
  long local_838;
  long lStack_830;
  timeval local_648;
  long *local_638;
  long local_630;
  long local_628;
  long lStack_620;
  undefined1 local_438 [8];
  pointer local_430;
  undefined1 local_428 [232];
  ios_base aiStack_340 [264];
  long local_238 [65];
  
  local_af8 = local_ae8;
  local_c98 = (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)fraction;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af8,"area","");
  local_bd8._M_dataplus._M_p = (pointer)&local_bd8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_bd8,local_af8,local_af8 + local_af0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a48,
                 "data/",&local_bd8);
  plVar5 = (long *)std::__cxx11::string::append(local_a48);
  local_848 = &local_838;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_838 = *plVar9;
    lStack_830 = plVar5[3];
  }
  else {
    local_838 = *plVar9;
    local_848 = (long *)*plVar5;
  }
  local_840 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_848,(ulong)local_bd8._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_628 = *plVar9;
    lStack_620 = plVar5[3];
    local_638 = &local_628;
  }
  else {
    local_628 = *plVar9;
    local_638 = (long *)*plVar5;
  }
  local_630 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_638);
  puVar10 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar10) {
    local_428._0_8_ = *puVar10;
    local_428._8_8_ = plVar5[3];
    local_438 = (undefined1  [8])local_428;
  }
  else {
    local_428._0_8_ = *puVar10;
    local_438 = (undefined1  [8])*plVar5;
  }
  local_430 = (pointer)plVar5[1];
  *plVar5 = (long)puVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ifstream::ifstream((istream *)local_238,(string *)local_438,_S_in);
  if (local_438 != (undefined1  [8])local_428) {
    operator_delete((void *)local_438);
  }
  if (local_638 != &local_628) {
    operator_delete(local_638);
  }
  if (local_848 != &local_838) {
    operator_delete(local_848);
  }
  local_b80 = (ios_base *)local_a48;
  local_b78 = (ios_base *)&local_848;
  local_b70 = (ios_base *)&local_638;
  if (local_a48 != (undefined1  [8])local_a38) {
    operator_delete((void *)local_a48);
  }
  local_bf0 = _VTT;
  local_be8 = __filebuf;
  local_b80 = local_b80 + 0xf8;
  local_b78 = (ios_base *)((long)local_b78 + 0xf8);
  local_b70 = (ios_base *)((long)local_b70 + 0xf8);
  local_ad0 = aiStack_340;
  local_b18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ac8 = local_ab8;
  local_ac0 = 0;
  local_ab8[0] = 0;
  local_430 = (pointer)0x0;
  local_428._0_8_ = local_428._0_8_ & 0xffffffffffffff00;
  local_b18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b18.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438 = (undefined1  [8])local_428;
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)local_438,cVar4);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_b18,(value_type *)local_438);
  }
  if (local_438 != (undefined1  [8])local_428) {
    operator_delete((void *)local_438);
  }
  std::ifstream::close();
  lVar7 = (long)local_b18.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b18.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  auVar24._8_4_ =
       (int)((long)local_b18.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b18.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 0x25);
  auVar24._0_8_ = lVar7;
  auVar24._12_4_ = 0x45300000;
  dStack_bb0 = auVar24._8_8_ - 1.9342813113834067e+25;
  local_bb8 = (dStack_bb0 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) *
              (double)local_c98;
  if (0.0 < local_bb8) {
    iVar13 = 1;
    lVar7 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_b68,
                  (value_type *)
                  ((long)&((local_b18.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7));
      dVar23 = (double)iVar13;
      lVar7 = lVar7 + 0x20;
      iVar13 = iVar13 + 1;
    } while (dVar23 < local_bb8);
  }
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Generating rules......",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  this = (BadBoy *)operator_new(0x90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a60,&local_b68);
  BadBoy::BadBoy(this,&local_a60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a60);
  (**(this->super_RuleGenerator)._vptr_RuleGenerator)(&local_b50,this);
  uVar16 = (int)((long)local_b50.
                       super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b50.
                       super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x55555555;
  if (0 < (int)uVar16) {
    uVar17 = (ulong)(uVar16 & 0x7fffffff);
    lVar7 = 0;
    do {
      std::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::
      pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true>
                ((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_438,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&((local_b50.
                              super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->second).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar7),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&((local_b50.
                              super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->first).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar7));
      std::
      vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
      ::
      emplace_back<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  *)&local_b50,
                 (pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_438);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_428 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_438);
      lVar7 = lVar7 + 0x30;
      uVar17 = uVar17 - 1;
    } while (uVar17 != 0);
  }
  Common::JAC_THRESHOLD = 0.7;
  local_be0 = (PolynomialJoiner *)operator_new(0x1f0);
  std::
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::vector(&local_a78,&local_b50);
  pcVar1 = local_c88 + 0x10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a90,&local_b68);
  PolynomialJoiner::PolynomialJoiner(local_be0,&local_a78,&local_a90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a90);
  std::
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~vector(&local_a78);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c88,
             vsnprintf,0x148,"%f",local_c98);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_c88,0,(char *)0x0,0x13175e);
  local_a48 = (undefined1  [8])local_a38;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar11) {
    local_a38[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_a38[0]._8_8_ = plVar5[3];
  }
  else {
    local_a38[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_a48 = (undefined1  [8])*plVar5;
  }
  local_a40 = plVar5[1];
  *plVar5 = (long)paVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append(local_a48,(ulong)local_bd8._M_dataplus._M_p);
  local_848 = &local_838;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_838 = *plVar9;
    lStack_830 = plVar5[3];
  }
  else {
    local_838 = *plVar9;
    local_848 = (long *)*plVar5;
  }
  local_840 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_848);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_628 = *plVar9;
    lStack_620 = plVar5[3];
    local_638 = &local_628;
  }
  else {
    local_628 = *plVar9;
    local_638 = (long *)*plVar5;
  }
  local_630 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ofstream::ofstream(local_438,(string *)&local_638,_S_out);
  if (local_638 != &local_628) {
    operator_delete(local_638);
  }
  if (local_848 != &local_838) {
    operator_delete(local_848);
  }
  if (local_a48 != (undefined1  [8])local_a38) {
    operator_delete((void *)local_a48);
  }
  if ((char *)local_c88._0_8_ != pcVar1) {
    operator_delete((void *)local_c88._0_8_);
  }
  if (0.0 < local_bb8) {
    iVar13 = 0;
    lVar7 = 8;
    do {
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_438,iVar13);
      local_638 = (long *)CONCAT71(local_638._1_7_,9);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_638,1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,*(char **)((long)local_b68.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           lVar7 + -8),
                          *(long *)((long)&((local_b68.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar7));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      iVar13 = iVar13 + 1;
      lVar7 = lVar7 + 0x20;
    } while ((double)iVar13 < local_bb8);
  }
  std::ofstream::close();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_cb8,vsnprintf,0x148,"%f",local_c98);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_cb8,0,(char *)0x0,0x13175e);
  psVar12 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar12) {
    local_c88._16_8_ = *psVar12;
    vStack_c70.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar5[3];
    local_c88._0_8_ = pcVar1;
  }
  else {
    local_c88._16_8_ = *psVar12;
    local_c88._0_8_ = (size_type *)*plVar5;
  }
  local_c88._8_8_ = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append(local_c88,(ulong)local_bd8._M_dataplus._M_p);
  local_a48 = (undefined1  [8])local_a38;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar11) {
    local_a38[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_a38[0]._8_8_ = plVar5[3];
  }
  else {
    local_a38[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_a48 = (undefined1  [8])*plVar5;
  }
  local_a40 = plVar5[1];
  *plVar5 = (long)paVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_a48);
  local_848 = &local_838;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_838 = *plVar9;
    lStack_830 = plVar5[3];
  }
  else {
    local_838 = *plVar9;
    local_848 = (long *)*plVar5;
  }
  local_840 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ofstream::ofstream(&local_638,(string *)&local_848,_S_out);
  if (local_848 != &local_838) {
    operator_delete(local_848);
  }
  if (local_a48 != (undefined1  [8])local_a38) {
    operator_delete((void *)local_a48);
  }
  if ((char *)local_c88._0_8_ != pcVar1) {
    operator_delete((void *)local_c88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p);
  }
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_c30,vsnprintf,0x148,"%f",local_c98);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_c30,0,(char *)0x0,0x13175e);
  local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_cb8.field_2._M_allocated_capacity = *psVar12;
    local_cb8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_cb8.field_2._M_allocated_capacity = *psVar12;
    local_cb8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_cb8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_cb8,(ulong)local_bd8._M_dataplus._M_p);
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    local_c88._16_8_ = *plVar9;
    vStack_c70.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar5[3];
    local_c88._0_8_ = pcVar1;
  }
  else {
    local_c88._16_8_ = *plVar9;
    local_c88._0_8_ = (long *)*plVar5;
  }
  local_c88._8_8_ = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_c88);
  local_a48 = (undefined1  [8])local_a38;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar11) {
    local_a38[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_a38[0]._8_8_ = plVar5[3];
  }
  else {
    local_a38[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_a48 = (undefined1  [8])*plVar5;
  }
  local_a40 = plVar5[1];
  *plVar5 = (long)paVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ofstream::ofstream(&local_848,(string *)local_a48,_S_out);
  if (local_a48 != (undefined1  [8])local_a38) {
    operator_delete((void *)local_a48);
  }
  if ((char *)local_c88._0_8_ != pcVar1) {
    operator_delete((void *)local_c88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
    operator_delete(local_c30._M_dataplus._M_p);
  }
  if (0.0 < local_bb8) {
    iVar13 = 0;
    iVar18 = 0;
    iVar19 = 0;
    do {
      Joiner::get_o_sigs_abi_cxx11_
                ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a48,&local_be0->super_Joiner,iVar13);
      for (uVar14 = local_a38[0]._M_allocated_capacity; (undefined8 *)uVar14 != (undefined8 *)0x0;
          uVar14 = *(undefined8 *)uVar14) {
        local_c88._0_8_ = local_c88 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c88,*(long *)(uVar14 + 8),
                   *(long *)(uVar14 + 0x10) + *(long *)(uVar14 + 8));
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_638,iVar19);
        local_cb8._M_dataplus._M_p._0_1_ = 9;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_cb8,1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
        local_cb8._M_dataplus._M_p._0_1_ = 9;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_cb8,1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_c88._0_8_,local_c88._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((undefined1 *)local_c88._0_8_ != local_c88 + 0x10) {
          operator_delete((void *)local_c88._0_8_);
        }
        iVar19 = iVar19 + 1;
      }
      PolynomialJoiner::get_t_sigs_abi_cxx11_
                ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c88,local_be0,iVar13);
      for (puVar15 = (undefined8 *)local_c88._16_8_; puVar15 != (undefined8 *)0x0;
          puVar15 = (undefined8 *)*puVar15) {
        local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_cb8,puVar15[1],puVar15[2] + puVar15[1]);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_848,iVar18);
        local_c30._M_dataplus._M_p._0_1_ = 9;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_c30,1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar13);
        local_c30._M_dataplus._M_p._0_1_ = 9;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_c30,1);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_cb8._M_dataplus._M_p,local_cb8._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
          operator_delete(local_cb8._M_dataplus._M_p);
        }
        iVar18 = iVar18 + 1;
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_c88);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_a48);
      iVar13 = iVar13 + 1;
    } while ((double)iVar13 < local_bb8);
  }
  std::ofstream::close();
  std::ofstream::close();
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_ba0,vsnprintf,0x148,"%f",local_c98);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_ba0,0,(char *)0x0,0x13175e);
  local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_c30.field_2._M_allocated_capacity = *psVar12;
    local_c30.field_2._8_8_ = plVar5[3];
  }
  else {
    local_c30.field_2._M_allocated_capacity = *psVar12;
    local_c30._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_c30._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c30,(ulong)local_bd8._M_dataplus._M_p);
  local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_cb8.field_2._M_allocated_capacity = *psVar12;
    local_cb8.field_2._8_8_ = plVar5[3];
  }
  else {
    local_cb8.field_2._M_allocated_capacity = *psVar12;
    local_cb8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_cb8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_cb8);
  psVar12 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar12) {
    local_c88._16_8_ = *psVar12;
    vStack_c70.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar5[3];
    local_c88._0_8_ = local_c88 + 0x10;
  }
  else {
    local_c88._16_8_ = *psVar12;
    local_c88._0_8_ = (size_type *)*plVar5;
  }
  local_c88._8_8_ = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::ofstream::ofstream(local_a48,(string *)local_c88,_S_out);
  if ((undefined1 *)local_c88._0_8_ != local_c88 + 0x10) {
    operator_delete((void *)local_c88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
    operator_delete(local_c30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
    operator_delete(local_ba0._M_dataplus._M_p);
  }
  if (0.0 < local_bb8) {
    iVar13 = 0;
    do {
      local_c8c = iVar13;
      Joiner::get_applicable_rules_abi_cxx11_(&local_aa8,&local_be0->super_Joiner,iVar13);
      local_cb8._M_dataplus._M_p = (pointer)&local_cb8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb8,"","");
      local_c98 = local_aa8.
                  super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      ppVar22 = local_aa8.
                super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_aa8.
          super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_aa8.
          super__Vector_base<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::
          pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pair((pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_c88,ppVar22);
          local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"","");
          local_ba0._M_dataplus._M_p = (pointer)&local_ba0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba0,"","");
          uVar14 = local_c88._8_8_;
          for (pbVar20 = (pointer)local_c88._0_8_;
              pbVar3 = vStack_c70.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
              pbVar21 = vStack_c70.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, pbVar20 != (pointer)uVar14;
              pbVar20 = pbVar20 + 1) {
            local_c10 = &local_c00;
            pcVar2 = (pbVar20->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c10,pcVar2,pcVar2 + pbVar20->_M_string_length);
            local_c50 = &local_c40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c50,local_c10,local_c08 + (long)local_c10);
            std::__cxx11::string::append((char *)&local_c50);
            std::__cxx11::string::_M_append((char *)&local_c30,(ulong)local_c50);
            if (local_c50 != &local_c40) {
              operator_delete(local_c50);
            }
            if (local_c10 != &local_c00) {
              operator_delete(local_c10);
            }
          }
          for (; pbVar21 != pbVar3; pbVar21 = pbVar21 + 1) {
            local_c10 = &local_c00;
            pcVar2 = (pbVar21->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c10,pcVar2,pcVar2 + pbVar21->_M_string_length);
            local_c50 = &local_c40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c50,local_c10,local_c08 + (long)local_c10);
            std::__cxx11::string::append((char *)&local_c50);
            std::__cxx11::string::_M_append((char *)&local_ba0,(ulong)local_c50);
            if (local_c50 != &local_c40) {
              operator_delete(local_c50);
            }
            if (local_c10 != &local_c00) {
              operator_delete(local_c10);
            }
          }
          local_b38[0] = local_b28;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b38,local_c30._M_dataplus._M_p,
                     local_c30._M_dataplus._M_p + local_c30._M_string_length);
          std::__cxx11::string::append((char *)local_b38);
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_b38,(ulong)local_ba0._M_dataplus._M_p);
          local_c50 = &local_c40;
          plVar9 = plVar5 + 2;
          if ((long *)*plVar5 == plVar9) {
            local_c40 = *plVar9;
            lStack_c38 = plVar5[3];
          }
          else {
            local_c40 = *plVar9;
            local_c50 = (long *)*plVar5;
          }
          local_c48 = plVar5[1];
          *plVar5 = (long)plVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_c50);
          local_c10 = &local_c00;
          plVar9 = plVar5 + 2;
          if ((long *)*plVar5 == plVar9) {
            local_c00 = *plVar9;
            lStack_bf8 = plVar5[3];
          }
          else {
            local_c00 = *plVar9;
            local_c10 = (long *)*plVar5;
          }
          local_c08 = plVar5[1];
          *plVar5 = (long)plVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_cb8,(ulong)local_c10);
          if (local_c10 != &local_c00) {
            operator_delete(local_c10);
          }
          if (local_c50 != &local_c40) {
            operator_delete(local_c50);
          }
          if (local_b38[0] != local_b28) {
            operator_delete(local_b38[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ba0._M_dataplus._M_p != &local_ba0.field_2) {
            operator_delete(local_ba0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
            operator_delete(local_c30._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&vStack_c70);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c88);
          ppVar22 = ppVar22 + 1;
        } while (ppVar22 != local_c98);
      }
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_a48,local_c8c);
      local_c88[0] = (string)0x9;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_c88,1);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_c8c);
      local_c88[0] = (string)0x9;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_c88,1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_cb8._M_dataplus._M_p,local_cb8._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
        operator_delete(local_cb8._M_dataplus._M_p);
      }
      std::
      vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~vector(&local_aa8);
      iVar13 = local_c8c + 1;
    } while ((double)iVar13 < local_bb8);
  }
  std::ofstream::close();
  uVar14 = local_be8;
  plVar5 = local_bf0;
  local_a48 = (undefined1  [8])local_bf0;
  *(undefined8 *)(local_a48 + local_bf0[-3]) = local_be8;
  std::filebuf::~filebuf((filebuf *)&local_a40);
  std::ios_base::~ios_base(local_b80);
  local_848 = plVar5;
  *(undefined8 *)((long)&local_848 + plVar5[-3]) = uVar14;
  std::filebuf::~filebuf((filebuf *)&local_840);
  std::ios_base::~ios_base(local_b78);
  local_638 = plVar5;
  *(undefined8 *)((long)&local_638 + plVar5[-3]) = uVar14;
  std::filebuf::~filebuf((filebuf *)&local_630);
  std::ios_base::~ios_base(local_b70);
  local_438 = (undefined1  [8])plVar5;
  *(undefined8 *)(local_438 + plVar5[-3]) = uVar14;
  std::filebuf::~filebuf((filebuf *)&local_430);
  std::ios_base::~ios_base(local_ad0);
  std::
  vector<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~vector(&local_b50);
  if (local_ac8 != local_ab8) {
    operator_delete(local_ac8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b18);
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
    operator_delete(local_bd8._M_dataplus._M_p);
  }
  if (local_af8 != local_ae8) {
    operator_delete(local_af8);
  }
  return;
}

Assistant:

void Exp::genDBData(double fraction)
{
	string files[] = {"area"};
	for (string file : files)
	{
		ifstream fin("data/" + file + "_names/" + file + "_names.txt");
		vector<string> cells_full, cells;
		string cell;
		for (string cell; getline(fin, cell); )
			cells_full.push_back(cell);
		fin.close();
		auto n = cells_full.size() * fraction;
		for (auto i = 0; i < n; i ++)
			cells.push_back(cells_full[i]);

		//generate rules
		struct timeval t1, t2;
		gettimeofday(&t1, NULL);
		cerr << "Generating rules......" << endl;
		RuleGenerator *ruleGenerator;
		ruleGenerator = new BadBoy(cells);
		vector<t_rule> rules = ruleGenerator->gen_rules();
		for (int i = 0, m = (int) rules.size(); i < m; i ++)
			rules.emplace_back(make_pair(rules[i].second, rules[i].first));

		//construct the joiner
		Common::JAC_THRESHOLD = 0.7;
		PolynomialJoiner *joiner = new PolynomialJoiner(rules, cells);

		//generate text file for name table
		ofstream fout1("exp/db/" + to_string(fraction) + file + "_name.txt");
		for (auto i = 0; i < n; i ++)
			fout1 << i << '\t' << cells[i] << endl;
		fout1.close();

		//generate text file for signature tables
		ofstream fout2("exp/db/" + to_string(fraction) + file + "_osig.txt");
		ofstream fout3("exp/db/" + to_string(fraction) + file + "_tsig.txt");
		int osig_id = 0;
		int tsig_id = 0;
		for (auto i = 0; i < n; i ++)
		{
			//osig
			unordered_set<string> o_sigs = joiner->get_o_sigs(i);
			for (string sigstr : o_sigs)
				fout2 << osig_id ++ << '\t' << i << '\t' << sigstr << endl;
			//tsig
			unordered_set<string> t_sigs = joiner->get_t_sigs(i);
			for (string sigstr : t_sigs)
				fout3 << tsig_id ++ << '\t' << i << '\t' << sigstr << endl;
		}
		fout2.close();
		fout3.close();

		//generate tex file for app_rule table
		ofstream fout4("exp/db/" + to_string(fraction) + file + "_apprule.txt");
		for (auto i = 0; i < n; i ++)
		{
			vector<t_rule> app_rules = joiner->get_applicable_rules(i);
			string app_rule_str = "";
			for (t_rule rule : app_rules)
			{
				string cur_lhs = "", cur_rhs = "";
				for (auto t : rule.first)
					cur_lhs += t + " ";
				for (auto t : rule.second)
					cur_rhs += t + " ";
				app_rule_str += cur_lhs + "|" + cur_rhs + "**";
			}
			fout4 << i << '\t' << i << '\t' << app_rule_str << endl;
		}
		fout4.close();
	}
}